

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O1

void __thiscall indigox::PeriodicTable::GeneratePeriodicTable(PeriodicTable *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pbVar4;
  long lVar5;
  int *piVar6;
  Element *this_00;
  int iVar7;
  int iVar8;
  String *this_01;
  pointer s_00;
  int local_1bc;
  String local_1b8;
  String path;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  String file;
  string local_140;
  Element_p elem;
  String n;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  String s;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  FileReader fr;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p
      [Options::DATA_DIRECTORY_abi_cxx11_._M_string_length - 1] != '/') {
    std::__cxx11::string::append((char *)&Options::DATA_DIRECTORY_abi_cxx11_);
  }
  path._M_dataplus._M_p = (pointer)&path.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&path,Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p,
             Options::DATA_DIRECTORY_abi_cxx11_._M_dataplus._M_p +
             Options::DATA_DIRECTORY_abi_cxx11_._M_string_length);
  file._M_dataplus._M_p = (pointer)&file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file,Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_dataplus._M_p,
             Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_dataplus._M_p +
             Options::PERIODIC_TABLE_FILE_abi_cxx11_._M_string_length);
  std::operator+(&n,&path,&file);
  utils::FileReader::FileReader(&fr,&n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)n._M_dataplus._M_p != &n.field_2) {
    operator_delete(n._M_dataplus._M_p,n.field_2._M_allocated_capacity + 1);
  }
  utils::FileReader::GetAllItems(&fr,&lines);
  n._M_dataplus._M_p = (pointer)&n.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&n,"");
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"");
  pbVar4 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_164 = 0.0;
    lVar5 = 0;
    local_c8 = 0;
    local_168 = 0.0;
    local_16c = 0.0;
    local_170 = 0.0;
    local_174 = 0.0;
    local_d0 = 0;
    local_d8 = 0;
    local_e0 = 0;
    local_e8 = 0;
    iVar8 = 0;
    s_00 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      switch(iVar8) {
      case 0:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_d0 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0011004d:
          std::__throw_out_of_range("stof");
        }
        if ((local_d0 - 0x80000000U < 0xffffffff00000000) || (iVar7 = *piVar6, iVar7 == 0x22))
        goto LAB_00110035;
        goto LAB_0010fc6c;
      case 1:
        utils::toUpperFirst(&local_1b8,s_00);
        this_01 = &n;
        goto LAB_0010fa99;
      case 2:
        utils::toUpperFirst(&local_1b8,s_00);
        this_01 = &s;
LAB_0010fa99:
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        break;
      case 3:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_174 = strtof(pcVar2,(char **)&local_1b8);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
LAB_00110029:
          std::__throw_invalid_argument("stof");
LAB_00110035:
          std::__throw_out_of_range("stoi");
        }
        if (*piVar6 == 0) {
LAB_0010fbf6:
          *piVar6 = local_1bc;
        }
        else if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 4:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        iVar7 = *piVar6;
        *piVar6 = 0;
        lVar5 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
          goto LAB_00110029;
        }
        if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar6 == 0x22)) goto LAB_00110011;
        if (*piVar6 == 0) {
          *piVar6 = iVar7;
        }
        break;
      case 5:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_c8 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_00110011:
          std::__throw_out_of_range("stoi");
        }
        if ((local_c8 - 0x80000000U < 0xffffffff00000000) || (iVar7 = *piVar6, iVar7 == 0x22))
        goto LAB_0010fff9;
        goto LAB_0010fc6c;
      case 6:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_d8 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010fff9:
          std::__throw_out_of_range("stoi");
        }
        if ((local_d8 - 0x80000000U < 0xffffffff00000000) || (iVar7 = *piVar6, iVar7 == 0x22))
        goto LAB_0010ffe1;
        goto LAB_0010fc6c;
      case 7:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_e0 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010ffe1:
          std::__throw_out_of_range("stoi");
        }
        if ((local_e0 - 0x80000000U < 0xffffffff00000000) || (iVar7 = *piVar6, iVar7 == 0x22))
        goto LAB_0010ffc9;
        goto LAB_0010fc6c;
      case 8:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_e8 = strtol(pcVar2,(char **)&local_1b8,10);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stoi");
LAB_0010ffc9:
          std::__throw_out_of_range("stoi");
        }
        if ((local_e8 - 0x80000000U < 0xffffffff00000000) || (iVar7 = *piVar6, iVar7 == 0x22))
        goto LAB_0010ffb1;
LAB_0010fc6c:
        if (iVar7 == 0) {
          *piVar6 = local_1bc;
        }
        break;
      case 9:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_170 = strtof(pcVar2,(char **)&local_1b8);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
LAB_0010ffa5:
          std::__throw_invalid_argument("stof");
LAB_0010ffb1:
          std::__throw_out_of_range("stoi");
        }
        if (*piVar6 == 0) goto LAB_0010fbf6;
        if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 10:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_16c = strtof(pcVar2,(char **)&local_1b8);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
LAB_0010ff99:
          std::__throw_invalid_argument("stof");
          goto LAB_0010ffa5;
        }
        if (*piVar6 == 0) goto LAB_0010fbf6;
        if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 0xb:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_168 = strtof(pcVar2,(char **)&local_1b8);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
LAB_0010ff8d:
          std::__throw_invalid_argument("stof");
          goto LAB_0010ff99;
        }
        if (*piVar6 == 0) goto LAB_0010fbf6;
        if (*piVar6 == 0x22) {
          std::__throw_out_of_range("stof");
        }
        break;
      case 0xc:
        pcVar2 = (s_00->_M_dataplus)._M_p;
        piVar6 = __errno_location();
        local_1bc = *piVar6;
        *piVar6 = 0;
        local_164 = strtof(pcVar2,(char **)&local_1b8);
        if (local_1b8._M_dataplus._M_p == pcVar2) {
          std::__throw_invalid_argument("stof");
          goto LAB_0010ff8d;
        }
        if (*piVar6 == 0) goto LAB_0010fbf6;
        if (*piVar6 == 0x22) goto LAB_0011004d;
      }
      if (iVar8 == 0xc) {
        this_00 = (Element *)operator_new(0x60);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,n._M_dataplus._M_p,n._M_dataplus._M_p + n._M_string_length);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,s._M_dataplus._M_p,s._M_dataplus._M_p + s._M_string_length);
        Element::Element(this_00,(uint8_t)local_d0,&local_98,&local_140,local_174,(uint8_t)lVar5,
                         (uint8_t)local_c8,(uint8_t)local_d8,(uint8_t)local_e0,(uint8_t)local_e8,
                         local_170,local_16c,local_168,local_164);
        elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<indigox::Element*>
                  (&elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        paVar1 = &local_1b8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_1b8._M_dataplus._M_p._0_1_ =
             (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Z_;
        std::
        _Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
        ::_M_emplace_unique<unsigned_char,std::shared_ptr<indigox::Element>&>
                  ((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>,std::_Select1st<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
                    *)this,(uchar *)&local_1b8,&elem);
        pcVar3 = ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 symbol_)._M_dataplus._M_p;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->symbol_)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
        ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
                    *)&this->name_to_,&local_1b8,&elem);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        pcVar3 = ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 name_)._M_dataplus._M_p;
        local_1b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + ((elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->name_)._M_string_length);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
        ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
                    *)&this->name_to_,&local_1b8,&elem);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        if (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (elem.super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        iVar8 = 0;
      }
      else {
        iVar8 = iVar8 + 1;
      }
      s_00 = s_00 + 1;
    } while (s_00 != pbVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)n._M_dataplus._M_p != &n.field_2) {
    operator_delete(n._M_dataplus._M_p,n.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fr.path_._M_dataplus._M_p != &fr.path_.field_2) {
    operator_delete(fr.path_._M_dataplus._M_p,fr.path_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file._M_dataplus._M_p != &file.field_2) {
    operator_delete(file._M_dataplus._M_p,file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)path._M_dataplus._M_p != &path.field_2) {
    operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return;
}

Assistant:

void PeriodicTable::GeneratePeriodicTable() {
    /// @todo Check for duplicate elements and skip them.
    /// @todo Ensure all columns are populated.
    std::vector<String> lines;
    if (Options::DATA_DIRECTORY.back() != '/') {
      Options::DATA_DIRECTORY.append("/");
    }
    String path = Options::DATA_DIRECTORY;
    String file = Options::PERIODIC_TABLE_FILE;
    //if (path.back() != '/') path.append("/");
    utils::FileReader fr(path + file);
    fr.GetAllItems(lines);
    
    String n = "", s = "";
    uint8_t g = 0, p = 0, z = 0, v = 0, o = 0, h = 0;
    Float m = 0.0f, r = 0.0f, c = 0.0f, V = 0.0f, e = 0.0f;
    int count = 0;
    
    for (String& line : lines) {
      switch (count) {
        case 0: z = std::stoi(line); break;
        case 1: n = utils::toUpperFirst(&line); break;
        case 2: s = utils::toUpperFirst(&line); break;
        case 3: m = std::stof(line); break;
        case 4: g = std::stoi(line); break;
        case 5: p = std::stoi(line); break;
        case 6: v = std::stoi(line); break;
        case 7: o = std::stoi(line); break;
        case 8: h = std::stoi(line); break;
        case 9: r = std::stof(line); break;
        case 10: c = std::stof(line); break;
        case 11: V = std::stof(line); break;
        case 12: e = std::stof(line); break;
        default:
          break;
      }
      
      if (count == 12) {
        Element_p elem = Element_p(new Element(z, n, s, m, g, p, v, o, h, r, c,
                                               V, e));
        z_to_.emplace(elem->GetAtomicNumber(), elem);
        name_to_.emplace(elem->GetSymbol(), elem);
        name_to_.emplace(elem->GetName(), elem);
        count = 0;
      } else count++;
    }
  }